

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdt.cpp
# Opt level: O0

ostream * __thiscall CDT::print(CDT *this,ostream *out)

{
  pointer pbVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  ostream *poVar5;
  reference pLVar6;
  Layer *layer;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Layer,_std::allocator<Layer>_> *__range1;
  uint local_34;
  undefined1 local_30 [4];
  uint i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  labels;
  ostream *out_local;
  CDT *this_local;
  
  labels.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)out;
  std::operator<<(out,"\tCDT-Model structure.\n");
  std::operator<<((ostream *)
                  labels.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage," | Data set status: ");
  bVar2 = DataSet::empty(&this->m_dataset);
  if (bVar2) {
    std::operator<<((ostream *)
                    labels.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,"None.\n");
  }
  else {
    std::operator<<((ostream *)
                    labels.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,"Ready.\n");
    std::operator<<((ostream *)
                    labels.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage," | Feautures: ");
    DataSet::labels_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_30,&this->m_dataset);
    local_34 = 0;
    while( true ) {
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_30);
      pbVar1 = labels.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (sVar3 <= local_34) break;
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_30,(ulong)local_34);
      std::operator<<((ostream *)pbVar1,(string *)pvVar4);
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_30);
      if ((ulong)local_34 < sVar3 - 1) {
        std::operator<<((ostream *)
                        labels.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,", ");
      }
      local_34 = local_34 + 1;
    }
    std::operator<<((ostream *)
                    labels.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,'\n');
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_30);
  }
  poVar5 = std::operator<<((ostream *)
                           labels.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage," | # of layers: ");
  sVar3 = std::vector<Layer,_std::allocator<Layer>_>::size(&this->m_layers);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar3);
  std::operator<<(poVar5,"\n");
  std::operator<<((ostream *)
                  labels.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage," \t");
  __end1 = std::vector<Layer,_std::allocator<Layer>_>::begin(&this->m_layers);
  layer = (Layer *)std::vector<Layer,_std::allocator<Layer>_>::end(&this->m_layers);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_Layer_*,_std::vector<Layer,_std::allocator<Layer>_>_>
                                *)&layer);
    if (!bVar2) break;
    pLVar6 = __gnu_cxx::
             __normal_iterator<const_Layer_*,_std::vector<Layer,_std::allocator<Layer>_>_>::
             operator*(&__end1);
    poVar5 = std::operator<<((ostream *)
                             labels.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,"|- ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(pLVar6->m_shape).n_col);
    std::operator<<(poVar5," -|");
    __gnu_cxx::__normal_iterator<const_Layer_*,_std::vector<Layer,_std::allocator<Layer>_>_>::
    operator++(&__end1);
  }
  std::operator<<((ostream *)
                  labels.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,'\n');
  std::operator<<((ostream *)
                  labels.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage," | Weight structure:");
  std::operator<<((ostream *)
                  labels.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,'\n');
  return (ostream *)
         labels.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
}

Assistant:

std::ostream& CDT::print(std::ostream& out) const{
    out<<"\tCDT-Model structure.\n";
    
    out<<" | Data set status: ";
    if(!m_dataset.empty()){
        out<<"Ready.\n";

        out<<" | Feautures: ";
        std::vector<std::string> labels=m_dataset.labels();
        for(unsigned i=0;i<labels.size();++i){
            out<<labels[i];
            if(i<labels.size()-1) out<<", ";
        }
        out<<'\n';
    } else  out<<"None.\n";

    out<<" | # of layers: "<<m_layers.size()<<"\n";
    out<<" \t";
    for(const auto& layer: m_layers)
        out<<"|- "<<layer.m_shape.n_col<<" -|";
    out<<'\n';

    out<<" | Weight structure:";
    out<<'\n';

    return out;
}